

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O2

vector<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
* __thiscall
absl::lts_20250127::cord_internal::CordzHandle::DiagnosticsGetSafeToInspectDeletedHandles
          (vector<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
           *__return_storage_ptr__,CordzHandle *this)

{
  MutexLock lock;
  CordzHandle *local_28;
  MutexLock local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->is_snapshot_ == true) {
    anon_unknown_0::GlobalQueue();
    local_20.mu_ = (Mutex *)&anon_unknown_0::GlobalQueue::global_queue;
    Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
    while( true ) {
      this = this->dq_next_;
      local_28 = this;
      if (this == (CordzHandle *)0x0) break;
      if (this->is_snapshot_ == false) {
        std::
        vector<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
        ::push_back(__return_storage_ptr__,&local_28);
        this = local_28;
      }
    }
    MutexLock::~MutexLock(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const CordzHandle*>
CordzHandle::DiagnosticsGetSafeToInspectDeletedHandles() {
  std::vector<const CordzHandle*> handles;
  if (!is_snapshot()) {
    return handles;
  }

  Queue& global_queue = GlobalQueue();
  MutexLock lock(&global_queue.mutex);
  for (const CordzHandle* p = dq_next_; p != nullptr; p = p->dq_next_) {
    if (!p->is_snapshot()) {
      handles.push_back(p);
    }
  }
  return handles;
}